

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O0

void amrex::putarray(ostream *os,Vector<long,_std::allocator<long>_> *ar)

{
  Long LVar1;
  ostream *poVar2;
  long *plVar3;
  ostream *in_RDI;
  int i;
  Vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffd0;
  int local_14;
  
  std::operator<<(in_RDI,'(');
  LVar1 = Vector<long,_std::allocator<long>_>::size((Vector<long,_std::allocator<long>_> *)0xfa32d1)
  ;
  poVar2 = (ostream *)std::ostream::operator<<(in_RDI,LVar1);
  std::operator<<(poVar2,", (");
  local_14 = 0;
  while( true ) {
    LVar1 = Vector<long,_std::allocator<long>_>::size
                      ((Vector<long,_std::allocator<long>_> *)0xfa3309);
    if (LVar1 <= local_14) break;
    poVar2 = in_RDI;
    plVar3 = Vector<long,_std::allocator<long>_>::operator[]
                       (in_stack_ffffffffffffffd0,(size_type)in_RDI);
    std::ostream::operator<<(poVar2,*plVar3);
    in_stack_ffffffffffffffd0 = (Vector<long,_std::allocator<long>_> *)(long)local_14;
    LVar1 = Vector<long,_std::allocator<long>_>::size
                      ((Vector<long,_std::allocator<long>_> *)0xfa334e);
    if (in_stack_ffffffffffffffd0 != (Vector<long,_std::allocator<long>_> *)(LVar1 + -1)) {
      std::operator<<(in_RDI,' ');
    }
    local_14 = local_14 + 1;
  }
  std::operator<<(in_RDI,"))");
  return;
}

Assistant:

PUTARRAY

std::ostream&
operator<< (std::ostream&         os,
            const RealDescriptor& rd)
{
  amrex::StreamRetry sr(os, "opRD", 4);

  while(sr.TryOutput()) {
    os << "(";
    putarray(os, rd.formatarray());
    os << ',';
    putarray(os, rd.orderarray());
    os << ")";
  }
  return os;
}